

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,Ptr<Catch::IStreamingReporter> *other)

{
  Ptr<Catch::IStreamingReporter> local_20;
  Ptr<Catch::IStreamingReporter> temp;
  Ptr<Catch::IStreamingReporter> *other_local;
  Ptr<Catch::IStreamingReporter> *this_local;
  
  temp.m_p = (IStreamingReporter *)other;
  Ptr(&local_20,other);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }